

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O3

void __thiscall chrono::ChLinkTSDA::ChLinkTSDA(ChLinkTSDA *this,ChLinkTSDA *other)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong rows;
  double *pdVar4;
  ChVariablesGenericDiagonalMass *pCVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int m_ndof;
  ChVariablesGenericDiagonalMass *this_00;
  Index index;
  ulong uVar13;
  long lVar14;
  Index size;
  undefined1 auVar15 [64];
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkTSDA_00b1aa60;
  (this->m_force_fun).
  super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_force_fun).
  super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  auVar15 = ZEXT464(0) << 0x40;
  this->m_loc1 = (ChVector<double>)auVar15._0_24_;
  this->m_loc2 = (ChVector<double>)auVar15._24_24_;
  (this->m_aloc1).m_data[0] = (double)auVar15._48_8_;
  (this->m_aloc1).m_data[1] = (double)auVar15._56_8_;
  *(undefined1 (*) [64])((this->m_loc2).m_data + 1) = auVar15;
  this->m_auto_rest_length = other->m_auto_rest_length;
  this->m_rest_length = other->m_rest_length;
  this->m_force = other->m_force;
  (this->m_force_fun).
  super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->m_force_fun).
       super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_force_fun).
              super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(other->m_force_fun).
              super___shared_ptr<chrono::ChLinkTSDA::ForceFunctor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this->m_ode_fun = other->m_ode_fun;
  this->m_nstates = other->m_nstates;
  pdVar3 = (other->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  rows = (other->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
  if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows
               ,1);
    if ((this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != rows) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this->m_states).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
           .m_data;
  uVar13 = rows + 7;
  if (-1 < (long)rows) {
    uVar13 = rows;
  }
  uVar13 = uVar13 & 0xfffffffffffffff8;
  if (7 < (long)rows) {
    lVar14 = 0;
    do {
      pdVar2 = pdVar3 + lVar14;
      dVar6 = pdVar2[1];
      dVar7 = pdVar2[2];
      dVar8 = pdVar2[3];
      dVar9 = pdVar2[4];
      dVar10 = pdVar2[5];
      dVar11 = pdVar2[6];
      dVar12 = pdVar2[7];
      pdVar1 = pdVar4 + lVar14;
      *pdVar1 = *pdVar2;
      pdVar1[1] = dVar6;
      pdVar1[2] = dVar7;
      pdVar1[3] = dVar8;
      pdVar1[4] = dVar9;
      pdVar1[5] = dVar10;
      pdVar1[6] = dVar11;
      pdVar1[7] = dVar12;
      lVar14 = lVar14 + 8;
    } while (lVar14 < (long)uVar13);
  }
  if ((long)uVar13 < (long)rows) {
    do {
      pdVar4[uVar13] = pdVar3[uVar13];
      uVar13 = uVar13 + 1;
    } while (rows != uVar13);
  }
  pCVar5 = other->m_variables;
  if (pCVar5 != (ChVariablesGenericDiagonalMass *)0x0) {
    this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
    m_ndof = (*(pCVar5->super_ChVariables)._vptr_ChVariables[2])(pCVar5);
    ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,m_ndof);
    this->m_variables = this_00;
    ChVariablesGenericDiagonalMass::operator=(this_00,other->m_variables);
  }
  return;
}

Assistant:

ChLinkTSDA::ChLinkTSDA(const ChLinkTSDA& other) : ChLink(other) {
    m_auto_rest_length = other.m_auto_rest_length;
    m_rest_length = other.m_rest_length;
    m_force = other.m_force;
    m_force_fun = other.m_force_fun;
    m_ode_fun = other.m_ode_fun;
    m_nstates = other.m_nstates;
    m_states = other.m_states;
    if (other.m_variables) {
        m_variables = new ChVariablesGenericDiagonalMass(other.m_variables->Get_ndof());
        (*m_variables) = (*other.m_variables);
    }
}